

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O1

void drawGui(void)

{
  cgltf_float **ptr_id;
  cgltf_animation_path_type t;
  cgltf_scene *pcVar1;
  cgltf_morph_target *pcVar2;
  cgltf_texture *pcVar3;
  cgltf_node *pcVar4;
  cgltf_animation *pcVar5;
  cgltf_animation_channel *pcVar6;
  cgltf_float *pcVar7;
  void *pvVar8;
  ImVec2 IVar9;
  cgltf_data *pcVar10;
  undefined8 uVar11;
  cgltf_mesh *pcVar12;
  bool bVar13;
  int iVar14;
  uint uVar15;
  char *pcVar16;
  long lVar17;
  char *pcVar18;
  char **ppcVar19;
  char (*xs) [2];
  u8 *puVar20;
  char (*x) [3];
  char (*x_00) [3];
  cgltf_sampler **ptr_id_00;
  cgltf_image *pcVar21;
  cgltf_sampler *pcVar22;
  u64 x_02;
  cgltf_accessor *pcVar23;
  cgltf_material *material;
  undefined8 *puVar24;
  cgltf_camera *ptr_id_01;
  size_t i_2;
  cgltf_size cVar25;
  char *pcVar26;
  cgltf_mesh *pcVar27;
  cgltf_primitive_type *pcVar28;
  cgltf_light *pcVar29;
  cgltf_skin *pcVar30;
  cgltf_size cVar31;
  cgltf_size cVar32;
  cgltf_mesh *pcVar33;
  cgltf_node **ppcVar34;
  cgltf_buffer_view_type *pcVar35;
  cgltf_mesh *pcVar36;
  long lVar37;
  cgltf_primitive *pcVar38;
  cgltf_skin *pcVar39;
  ulong uVar40;
  cgltf_image *ptr_id_02;
  size_t i;
  long lVar41;
  cgltf_morph_target *ptr_id_03;
  cgltf_attribute *pcVar42;
  ImVec2 IVar43;
  ImVec2 IVar44;
  void *pvVar45;
  float fVar46;
  CStr str;
  CStr str_00;
  CStr str_01;
  CStr str_02;
  CStr str_03;
  CStr str_04;
  CStr str_05;
  CStr str_06;
  size_t requiredMem;
  undefined1 local_c0 [8];
  undefined8 uStack_b8;
  uint local_b0;
  undefined1 local_a8 [16];
  Span<char> local_98;
  FmtBuffer local_88;
  cgltf_mesh *local_70;
  cgltf_mesh *local_68;
  cgltf_mesh *local_60;
  cgltf_skin *local_58;
  Span<char> local_50;
  cgltf_mesh *local_40;
  cgltf_mesh *local_38;
  unsigned_long *x_01;
  
  if (parsedData == (cgltf_data *)0x0) {
    ImGui::Begin("drag & drop a glTF file##0",(bool *)0x0,0);
  }
  else {
    local_c0._0_4_ = 1.0;
    local_c0._4_4_ = 1.0;
    ImGui::PushStyleVar(1,(ImVec2 *)local_c0);
    pcVar16 = (char *)(ulong)(uint)scratch._size;
    local_c0 = (undefined1  [8])scratch._data;
    uStack_b8 = scratch._data;
    local_b0 = (uint)scratch._size;
    tl::CStrT<char>::CStrT((CStrT<char> *)&local_50,&openedFilePath);
    str._str = pcVar16;
    str._0_8_ = local_50._size;
    tl::toStringBufferT((tl *)local_c0,(FmtBuffer *)((ulong)local_50._data & 0xffffffff),str);
    tl::CStrT<char>::CStrT((CStrT<char> *)local_a8,"##0");
    str_00._str = pcVar16;
    str_00._0_8_ = local_a8._8_8_;
    tl::toStringBufferT((tl *)local_c0,(FmtBuffer *)(local_a8._0_8_ & 0xffffffff),str_00);
    if (local_b0 == 0) {
      uStack_b8[-1] = '\0';
    }
    else {
      *uStack_b8 = '\0';
      uStack_b8 = uStack_b8 + 1;
      local_b0 = local_b0 - 1;
    }
    ImGui::Begin((char *)scratch._data,(bool *)0x0,0);
    ImGui::PopStyleVar(1);
    bVar13 = ImGui::BeginTabBar("TopTabBar",0);
    if (bVar13) {
      bVar13 = ImGui::BeginTabItem("Scenes",(bool *)0x0,0);
      if (bVar13) {
        if (drawGui_scenesTab()::rightPanelSize == '\0') {
          drawGui();
        }
        IVar9 = ImGui::GetWindowSize();
        drawGui_scenesTab()::leftPanelSize = drawGui_scenesTab()::leftPanelSize * IVar9.x;
        drawGui_scenesTab()::rightPanelSize = IVar9.x * drawGui_scenesTab()::rightPanelSize;
        Splitter(true,4.0,&drawGui_scenesTab()::leftPanelSize,&drawGui_scenesTab()::rightPanelSize,
                 0.0,0.0,-1.0);
        local_c0._0_4_ = 4.0;
        local_c0._4_4_ = 4.0;
        ImGui::PushStyleVar(0xd,(ImVec2 *)local_c0);
        local_c0._4_4_ = -1.0;
        local_c0._0_4_ = drawGui_scenesTab()::leftPanelSize;
        ImGui::BeginChild("left_panel",(ImVec2 *)local_c0,true,0x10000);
        local_a8._0_8_ = "";
        if ((long)(int)imgui_state::selectedSceneInd != -1) {
          local_a8._0_8_ = parsedData->scenes[(int)imgui_state::selectedSceneInd].name;
          if ((cgltf_mesh *)local_a8._0_8_ == (cgltf_mesh *)0x0) {
            local_a8._0_8_ = "";
          }
          ppcVar19 = (char **)(ulong)(uint)scratch._size;
          local_c0 = (undefined1  [8])scratch._data;
          uStack_b8 = scratch._data;
          local_b0 = (uint)scratch._size;
          tl::toStringBufferT((FmtBuffer *)local_c0,imgui_state::selectedSceneInd);
          tl::fmtBufferAppend<char[3],char_const*>((tl *)local_c0,(FmtBuffer *)local_a8,x,ppcVar19);
          if (local_b0 == 0) {
            uStack_b8[-1] = '\0';
          }
          else {
            *uStack_b8 = '\0';
            uStack_b8 = uStack_b8 + 1;
            local_b0 = local_b0 - 1;
          }
        }
        bVar13 = ImGui::BeginCombo("scene",(char *)scratch._data,0);
        if (bVar13) {
          if (0 < (int)parsedData->scenes_count) {
            lVar37 = 0;
            lVar41 = 0;
            do {
              ImGui::PushID((void *)((long)&parsedData->scenes->name + lVar37));
              local_a8._0_8_ = *(long *)((long)&parsedData->scenes->name + lVar37);
              if ((cgltf_mesh *)local_a8._0_8_ == (cgltf_mesh *)0x0) {
                local_a8._0_8_ = "";
              }
              ppcVar19 = (char **)(ulong)(uint)scratch._size;
              local_c0 = (undefined1  [8])scratch._data;
              uStack_b8 = scratch._data;
              local_b0 = (uint)scratch._size;
              tl::toStringBufferT((FmtBuffer *)local_c0,(uint)lVar41);
              tl::fmtBufferAppend<char[3],char_const*>
                        ((tl *)local_c0,(FmtBuffer *)local_a8,x_00,ppcVar19);
              if (local_b0 == 0) {
                uStack_b8[-1] = '\0';
              }
              else {
                *uStack_b8 = '\0';
                uStack_b8 = uStack_b8 + 1;
                local_b0 = local_b0 - 1;
              }
              local_c0._0_4_ = 0.0;
              local_c0._4_4_ = 0.0;
              bVar13 = ImGui::Selectable((char *)scratch._data,false,0,(ImVec2 *)local_c0);
              if (bVar13) {
                imgui_state::selectedSceneInd = (uint)lVar41;
              }
              ImGui::PopID();
              lVar41 = lVar41 + 1;
              lVar37 = lVar37 + 0x28;
            } while (lVar41 < (int)parsedData->scenes_count);
          }
          ImGui::EndCombo();
        }
        lVar37 = (long)(int)imgui_state::selectedSceneInd;
        if ((lVar37 != -1) && (pcVar1 = parsedData->scenes, pcVar1[lVar37].nodes_count != 0)) {
          uVar40 = 0;
          do {
            if (pcVar1[lVar37].nodes[uVar40]->parent == (cgltf_node *)0x0) {
              sceneNodeGuiRecursive(pcVar1[lVar37].nodes[uVar40]);
            }
            uVar40 = uVar40 + 1;
          } while (uVar40 < pcVar1[lVar37].nodes_count);
        }
        ImGui::EndChild();
        ImGui::SameLine(0.0,-1.0);
        local_c0._4_4_ = -1.0;
        local_c0._0_4_ = drawGui_scenesTab()::rightPanelSize;
        ImGui::BeginChild("right_panel",(ImVec2 *)local_c0,true,0);
        if (selectedNode == (cgltf_node *)0x0) {
          ImGui::Text("Nothing selected");
        }
        else {
          ImGui::Text("Node index: %ld",
                      ((long)selectedNode - (long)parsedData->nodes >> 3) * -0x7b425ed097b425ed);
          pcVar39 = selectedNode->skin;
          if (pcVar39 != (cgltf_skin *)0x0) {
            ImGui::Text("Skin: %s(%ld)",pcVar39->name,
                        ((long)pcVar39 - (long)parsedData->skins >> 3) * 0x6db6db6db6db6db7);
          }
          if (selectedNode->mesh != (cgltf_mesh *)0x0) {
            ImGui::Text("Mesh: %ld",
                        ((long)selectedNode->mesh - (long)parsedData->meshes >> 3) *
                        -0x71c71c71c71c71c7);
          }
          if (selectedNode->camera != (cgltf_camera *)0x0) {
            ImGui::Text("Camera: %ld");
          }
          if (selectedNode->light != (cgltf_light *)0x0) {
            ImGui::Text("Light: %ld");
          }
          if ((selectedNode->weights != (cgltf_float *)0x0) &&
             (bVar13 = ImGui::TreeNode(&selectedNode->weights,"Weights(%ld)",
                                       selectedNode->weights_count), bVar13)) {
            if (selectedNode->weights_count != 0) {
              uVar40 = 0;
              do {
                ImGui::Text("%g",SUB84((double)selectedNode->weights[uVar40],0));
                uVar40 = uVar40 + 1;
              } while (uVar40 < selectedNode->weights_count);
            }
            ImGui::TreePop();
          }
          if (selectedNode->has_translation != 0) {
            ImGui::Text("Translation: {%g, %g, %g}",SUB84((double)selectedNode->translation[0],0),
                        (double)selectedNode->translation[1],(double)selectedNode->translation[2]);
          }
          if (selectedNode->has_rotation != 0) {
            ImGui::Text("Rotation: {%g, %g, %g, %g}",SUB84((double)selectedNode->rotation[0],0),
                        (double)selectedNode->rotation[1],(double)selectedNode->rotation[2],
                        SUB84((double)selectedNode->rotation[3],0));
          }
          if (selectedNode->has_scale != 0) {
            ImGui::Text("Scale: {%g, %g, %g}",SUB84((double)selectedNode->scale[0],0),
                        (double)selectedNode->scale[1],(double)selectedNode->scale[2]);
          }
          if (selectedNode->has_matrix != 0) {
            ImGui::Text("Matrix: {\n  %g, %g, %g, %g,\n  %g, %g, %g, %g,\n  %g, %g, %g, %g,\n  %g, %g, %g, %g}"
                        ,SUB84((double)selectedNode->matrix[0],0),(double)selectedNode->matrix[1],
                        (double)selectedNode->matrix[2],SUB84((double)selectedNode->matrix[3],0),
                        (double)selectedNode->matrix[4],(double)selectedNode->matrix[4],
                        (double)selectedNode->matrix[6],(double)selectedNode->matrix[7]);
          }
        }
        ImGui::EndChild();
        ImGui::PopStyleVar(1);
        IVar9 = ImGui::GetWindowSize();
        drawGui_scenesTab()::leftPanelSize = drawGui_scenesTab()::leftPanelSize / IVar9.x;
        IVar9 = ImGui::GetWindowSize();
        drawGui_scenesTab()::rightPanelSize = drawGui_scenesTab()::rightPanelSize / IVar9.x;
        ImGui::EndTabItem();
      }
      bVar13 = ImGui::BeginTabItem("Meshes",(bool *)0x0,0);
      if (bVar13) {
        pcVar33 = parsedData->meshes;
        pcVar27 = (cgltf_mesh *)parsedData->meshes_count;
        local_a8._0_8_ = (cgltf_mesh *)0x0;
        pcVar36 = pcVar27;
        pcVar12 = pcVar33;
        if (pcVar27 != (cgltf_mesh *)0x0) {
          do {
            local_40 = pcVar12;
            local_68 = pcVar36;
            uVar11 = local_a8._0_8_;
            uStack_b8 = (u8 *)CONCAT44(scratch._size._4_4_,(uint)scratch._size);
            local_c0 = (undefined1  [8])scratch._data;
            local_50._data = pcVar33[local_a8._0_8_].name;
            if ((u8 *)local_50._data == (u8 *)0x0) {
              local_50._data = "";
            }
            local_60 = (cgltf_mesh *)local_a8._0_8_;
            tl::toStringBuffer<unsigned_long,char[3],char_const*>
                      ((Span<char> *)local_c0,(unsigned_long *)local_a8,(char (*) [3])&local_50,
                       (char **)0x39a80b);
            bVar13 = ImGui::CollapsingHeader((char *)scratch._data,0);
            if (bVar13) {
              pcVar36 = pcVar33 + uVar11;
              ImGui::TreePush((void *)0x0);
              bVar13 = ImGui::TreeNode(pcVar36,"Primitives (%ld)",pcVar36->primitives_count);
              if (bVar13) {
                pcVar39 = (cgltf_skin *)pcVar36->primitives_count;
                if (pcVar39 != (cgltf_skin *)0x0) {
                  pcVar30 = (cgltf_skin *)0x0;
                  local_70 = pcVar36;
                  local_58 = pcVar39;
                  do {
                    pcVar38 = pcVar36->primitives + (long)pcVar30;
                    bVar13 = ImGui::TreeNode(pcVar38,"%ld",pcVar30);
                    if (bVar13) {
                      cgltfPrimitiveTypeStr(pcVar38->type);
                      ImGui::Text("Type: %s");
                      pcVar23 = pcVar38->indices;
                      if ((pcVar23 != (cgltf_accessor *)0x0) &&
                         (bVar13 = ImGui::TreeNode(pcVar23,"Indices (accessor %ld)",
                                                   ((long)pcVar23 - (long)parsedData->accessors >> 4
                                                   ) * -0x79435e50d79435e5), bVar13)) {
                        imguiAccessor(pcVar38->indices);
                        ImGui::TreePop();
                      }
                      if (pcVar38->material == (cgltf_material *)0x0) {
                        ImGui::Text("Material: NULL");
                      }
                      else {
                        bVar13 = ImGui::TreeNode(&pcVar38->material,"Material (%ld)",
                                                 ((long)pcVar38->material -
                                                  (long)parsedData->materials >> 3) *
                                                 0x7e3f1f8fc7e3f1f9);
                        if (bVar13) {
                          imguiMaterial(pcVar38->material);
                          ImGui::TreePop();
                        }
                      }
                      local_88.end = (char *)pcVar30;
                      bVar13 = ImGui::TreeNode("Attributes");
                      if (bVar13) {
                        cVar25 = pcVar38->attributes_count;
                        if (cVar25 != 0) {
                          pcVar42 = pcVar38->attributes;
                          cVar31 = 0;
                          do {
                            bVar13 = ImGui::TreeNode(pcVar42,"%ld) %s",cVar31);
                            if (bVar13) {
                              imguiAttribute(pcVar42);
                              ImGui::TreePop();
                            }
                            cVar31 = cVar31 + 1;
                            pcVar42 = pcVar42 + 1;
                          } while (cVar25 != cVar31);
                        }
                        ImGui::TreePop();
                      }
                      if (((pcVar38->targets != (cgltf_morph_target *)0x0) &&
                          (bVar13 = ImGui::TreeNode("Morph targets"), bVar13)) &&
                         (local_88._16_8_ = pcVar38->targets_count, local_88._16_8_ != 0)) {
                        pcVar2 = pcVar38->targets;
                        cVar25 = 0;
                        do {
                          if (pcVar2[cVar25].attributes == (cgltf_attribute *)0x0) {
                            ImGui::Text("Attributes: (null)");
                          }
                          else {
                            ptr_id_03 = pcVar2 + cVar25;
                            bVar13 = ImGui::TreeNode(ptr_id_03,"Attributes");
                            if ((bVar13) && (cVar31 = ptr_id_03->attributes_count, cVar31 != 0)) {
                              pcVar42 = ptr_id_03->attributes;
                              cVar32 = 0;
                              do {
                                bVar13 = ImGui::TreeNode(pcVar42,"%ld) %s",cVar32);
                                if (bVar13) {
                                  imguiAttribute(pcVar42);
                                  ImGui::TreePop();
                                }
                                cVar32 = cVar32 + 1;
                                pcVar42 = pcVar42 + 1;
                              } while (cVar31 != cVar32);
                            }
                          }
                          cVar25 = cVar25 + 1;
                        } while (cVar25 != local_88._16_8_);
                      }
                      ImGui::TreePop();
                      pcVar30 = (cgltf_skin *)local_88.end;
                      pcVar36 = local_70;
                      pcVar39 = local_58;
                    }
                    pcVar30 = (cgltf_skin *)((long)&pcVar30->name + 1);
                  } while (pcVar30 != pcVar39);
                }
                ImGui::TreePop();
                pcVar33 = local_40;
                pcVar27 = local_68;
              }
              ImGui::TreePop();
            }
            local_a8._0_8_ = (long)&local_60->name + 1;
            pcVar36 = local_68;
            pcVar12 = local_40;
          } while ((cgltf_mesh *)local_a8._0_8_ != pcVar27);
        }
        ImGui::EndTabItem();
      }
      bVar13 = ImGui::BeginTabItem("Textures",(bool *)0x0,0);
      if (bVar13) {
        pcVar3 = parsedData->textures;
        IVar9 = (ImVec2)parsedData->textures_count;
        local_50._size = CONCAT44(scratch._size._4_4_,(uint)scratch._size);
        local_50._data = (char *)scratch._data;
        local_c0 = (undefined1  [8])IVar9;
        tl::toStringBuffer<char[11],unsigned_long,char[2]>
                  (&local_50,(char (*) [11])"Textures (",(unsigned_long *)local_c0,
                   (char (*) [2])scratch._data);
        bVar13 = ImGui::CollapsingHeader((char *)scratch._data,0);
        if ((bVar13) && (local_c0._0_4_ = 0.0, local_c0._4_4_ = 0.0, IVar9 != (ImVec2)0x0)) {
          ptr_id_00 = &pcVar3->sampler;
          IVar43.x = 1.4013e-45;
          IVar43.y = 0.0;
          do {
            IVar44 = IVar43;
            local_98._size = CONCAT44(scratch._size._4_4_,(uint)scratch._size);
            local_98._data = (char *)scratch._data;
            local_a8._0_8_ = ((cgltf_texture *)(ptr_id_00 + -2))->name;
            if ((cgltf_mesh *)local_a8._0_8_ == (cgltf_mesh *)0x0) {
              local_a8._0_8_ = "";
            }
            tl::toStringBuffer<unsigned_long,char[3],char_const*>
                      (&local_98,(unsigned_long *)local_c0,(char (*) [3])local_a8,(char **)0x39a80b)
            ;
            bVar13 = ImGui::TreeNode((cgltf_texture *)(ptr_id_00 + -2),"%s",scratch._data);
            if (bVar13) {
              if ((cgltf_image *)ptr_id_00[-1] == (cgltf_image *)0x0) {
                ImGui::Text("image: (null)");
              }
              else {
                bVar13 = ImGui::TreeNode(ptr_id_00 + -1,"image");
                if (bVar13) {
                  pcVar21 = (cgltf_image *)ptr_id_00[-1];
                  lVar37 = (long)pcVar21 - (long)parsedData->images >> 4;
                  ImGui::Text("Name: %s",pcVar21->name);
                  ImGui::Text("File path: %s",pcVar21->uri);
                  ImGui::Text("MIME Type: %s",pcVar21->mime_type);
                  ImGui::Text("Size: %dx%d",
                              (ulong)*(uint *)(&gpu::textureSizes + lVar37 * 0xaaaaaaaaaaaaaab),
                              (ulong)*(uint *)((long)&gpu::textureSizes +
                                              lVar37 * 0x5555555555555558 + 4));
                  imguiTexture(lVar37 * -0x5555555555555555,
                               (float *)(&imgui_state::textureHeights + lVar37 * -0x1555555555555555
                                        ));
                  ImGui::TreePop();
                }
              }
              if (*ptr_id_00 == (cgltf_sampler *)0x0) {
                ImGui::Text("sampler: (null)");
              }
              else {
                bVar13 = ImGui::TreeNode(ptr_id_00,"sampler");
                if (bVar13) {
                  pcVar22 = *ptr_id_00;
                  pcVar16 = glMinFilterModeStr(pcVar22->min_filter);
                  ImGui::Text("Min filter: %s",pcVar16);
                  pcVar16 = glMinFilterModeStr(pcVar22->mag_filter);
                  ImGui::Text("Mag filter: %s",pcVar16);
                  pcVar16 = glTextureWrapModeStr(pcVar22->wrap_s);
                  ImGui::Text("Wrap mode S: %s",pcVar16);
                  pcVar16 = glTextureWrapModeStr(pcVar22->wrap_t);
                  ImGui::Text("Wrap mode T: %s",pcVar16);
                  ImGui::TreePop();
                }
              }
              ImGui::TreePop();
            }
            ptr_id_00 = ptr_id_00 + 5;
            IVar43 = (ImVec2)((long)IVar44 + 1);
            local_c0 = (undefined1  [8])IVar44;
          } while (IVar44 != IVar9);
        }
        pcVar21 = parsedData->images;
        pcVar39 = (cgltf_skin *)parsedData->images_count;
        xs = (char (*) [2])(ulong)(uint)scratch._size;
        local_c0 = (undefined1  [8])scratch._data;
        uStack_b8 = scratch._data;
        local_b0 = (uint)scratch._size;
        local_88.start = (char *)pcVar39;
        tl::CStrT<char>::CStrT((CStrT<char> *)local_a8,"Images (");
        str_01._str = *xs;
        str_01._0_8_ = local_a8._8_8_;
        tl::toStringBufferT((tl *)local_c0,(FmtBuffer *)(local_a8._0_8_ & 0xffffffff),str_01);
        tl::fmtBufferAppend<unsigned_long,char[2]>((tl *)local_c0,&local_88,x_01,xs);
        if (local_b0 == 0) {
          uStack_b8[-1] = '\0';
        }
        else {
          *uStack_b8 = '\0';
          uStack_b8 = uStack_b8 + 1;
          local_b0 = local_b0 - 1;
        }
        bVar13 = ImGui::CollapsingHeader((char *)scratch._data,0);
        if (pcVar39 != (cgltf_skin *)0x0 && bVar13) {
          pcVar30 = (cgltf_skin *)0x0;
          ptr_id_02 = pcVar21;
          do {
            bVar13 = ImGui::TreeNode(ptr_id_02,"%ld",pcVar30);
            if (bVar13) {
              lVar37 = (long)pcVar21 - (long)parsedData->images >> 4;
              ImGui::Text("Name: %s",ptr_id_02->name);
              ImGui::Text("File path: %s",ptr_id_02->uri);
              ImGui::Text("MIME Type: %s",ptr_id_02->mime_type);
              ImGui::Text("Size: %dx%d",
                          (ulong)*(uint *)(&gpu::textureSizes + lVar37 * 0xaaaaaaaaaaaaaab),
                          (ulong)*(uint *)((long)&gpu::textureSizes +
                                          lVar37 * 0x5555555555555558 + 4));
              imguiTexture(lVar37 * -0x5555555555555555,
                           (float *)(&imgui_state::textureHeights + lVar37 * -0x1555555555555555));
              ImGui::TreePop();
            }
            pcVar30 = (cgltf_skin *)((long)&pcVar30->name + 1);
            ptr_id_02 = ptr_id_02 + 1;
            pcVar21 = pcVar21 + 1;
          } while (pcVar39 != pcVar30);
        }
        pcVar22 = parsedData->samplers;
        pcVar33 = (cgltf_mesh *)parsedData->samplers_count;
        uStack_b8 = (u8 *)CONCAT44(scratch._size._4_4_,(uint)scratch._size);
        local_c0 = (undefined1  [8])scratch._data;
        local_a8._0_8_ = pcVar33;
        tl::toStringBuffer<char[11],unsigned_long,char[2]>
                  ((Span<char> *)local_c0,(char (*) [11])"Samplers (",(unsigned_long *)local_a8,
                   (char (*) [2])scratch._data);
        bVar13 = ImGui::CollapsingHeader((char *)scratch._data,0);
        if (pcVar33 != (cgltf_mesh *)0x0 && bVar13) {
          pcVar27 = (cgltf_mesh *)0x0;
          do {
            bVar13 = ImGui::TreeNode(pcVar22,"%ld",pcVar27);
            if (bVar13) {
              pcVar16 = glMinFilterModeStr(pcVar22->min_filter);
              ImGui::Text("Min filter: %s",pcVar16);
              pcVar16 = glMinFilterModeStr(pcVar22->mag_filter);
              ImGui::Text("Mag filter: %s",pcVar16);
              pcVar16 = glTextureWrapModeStr(pcVar22->wrap_s);
              ImGui::Text("Wrap mode S: %s",pcVar16);
              glTextureWrapModeStr(pcVar22->wrap_t);
              ImGui::Text("Wrap mode T: %s");
              ImGui::TreePop();
            }
            pcVar27 = (cgltf_mesh *)((long)&pcVar27->name + 1);
            pcVar22 = pcVar22 + 1;
          } while (pcVar33 != pcVar27);
        }
        ImGui::EndTabItem();
      }
      bVar13 = ImGui::BeginTabItem("Buffers",(bool *)0x0,0);
      if (bVar13) {
        local_88._16_8_ = parsedData->buffers_count;
        if (local_88._16_8_ != 0) {
          local_88.end = (char *)parsedData->buffers;
          x_02 = 0;
          do {
            pcVar18 = local_88.end;
            pcVar16 = ((char **)local_88.end)[x_02 * 5];
            if ((drawGui_buffersTab()::unitsStrs == '\0') &&
               (iVar14 = __cxa_guard_acquire(&drawGui_buffersTab()::unitsStrs), iVar14 != 0)) {
              tl::CStrT<char>::CStrT((CStrT<char> *)drawGui_buffersTab()::unitsStrs,"bytes");
              tl::CStrT<char>::CStrT((CStrT<char> *)(drawGui_buffersTab()::unitsStrs + 0x10),"KB");
              tl::CStrT<char>::CStrT((CStrT<char> *)(drawGui_buffersTab()::unitsStrs + 0x20),"MB");
              tl::CStrT<char>::CStrT((CStrT<char> *)(drawGui_buffersTab()::unitsStrs + 0x30),"GB");
              __cxa_guard_release(&drawGui_buffersTab()::unitsStrs);
            }
            lVar37 = 0;
            pcVar26 = pcVar16;
            if ((char *)0x400 < pcVar16) {
              do {
                pcVar16 = (char *)((ulong)pcVar26 >> 10);
                lVar37 = lVar37 + 1;
                bVar13 = "" < pcVar26;
                pcVar26 = pcVar16;
              } while (bVar13);
            }
            ppcVar34 = ((cgltf_node ***)((long)pcVar18 + 8))[x_02 * 5];
            if (ppcVar34 == (cgltf_node **)0x0) {
              ppcVar34 = (cgltf_node **)0x39a80b;
            }
            local_c0 = (undefined1  [8])scratch._data;
            uStack_b8 = scratch._data;
            local_b0 = (uint)scratch._size;
            puVar20 = scratch._data;
            tl::toStringBufferT((FmtBuffer *)local_c0,x_02);
            tl::CStrT<char>::CStrT((CStrT<char> *)local_a8,") ");
            str_02._str = (char *)puVar20;
            str_02._0_8_ = local_a8._8_8_;
            tl::toStringBufferT((tl *)local_c0,(FmtBuffer *)(local_a8._0_8_ & 0xffffffff),str_02);
            tl::CStrT<char>::CStrT((CStrT<char> *)local_a8,(char *)ppcVar34);
            str_03._str = (char *)puVar20;
            str_03._0_8_ = local_a8._8_8_;
            tl::toStringBufferT((tl *)local_c0,(FmtBuffer *)(local_a8._0_8_ & 0xffffffff),str_03);
            tl::toStringBufferT((FmtBuffer *)local_c0,(u64)pcVar16);
            str_04._str = (char *)puVar20;
            str_04._0_8_ = *(undefined8 *)(drawGui_buffersTab()::unitsStrs + lVar37 * 0x10 + 8);
            tl::toStringBufferT((tl *)local_c0,
                                (FmtBuffer *)
                                (ulong)*(uint *)(drawGui_buffersTab()::unitsStrs + lVar37 * 0x10),
                                str_04);
            if (local_b0 == 0) {
              uStack_b8[-1] = '\0';
            }
            else {
              *uStack_b8 = '\0';
              uStack_b8 = uStack_b8 + 1;
              local_b0 = local_b0 - 1;
            }
            ImGui::CollapsingHeader((char *)scratch._data,0);
            x_02 = x_02 + 1;
          } while (x_02 != local_88._16_8_);
        }
        ImGui::EndTabItem();
      }
      bVar13 = ImGui::BeginTabItem("BufferViews",(bool *)0x0,0);
      if (bVar13) {
        cVar25 = parsedData->buffer_views_count;
        local_a8._0_8_ = (cgltf_mesh *)0x0;
        if (cVar25 != 0) {
          pcVar35 = &parsedData->buffer_views->type;
          pcVar33 = (cgltf_mesh *)0x1;
          do {
            pcVar27 = pcVar33;
            uStack_b8 = (u8 *)CONCAT44(scratch._size._4_4_,(uint)scratch._size);
            local_c0 = (undefined1  [8])scratch._data;
            tl::toStringBuffer<unsigned_long>((Span<char> *)local_c0,(unsigned_long *)local_a8);
            bVar13 = ImGui::CollapsingHeader((char *)scratch._data,0);
            if (bVar13) {
              ImGui::TreePush((void *)0x0);
              ImGui::Text("Type: %s",
                          _ZZL22drawGui_bufferViewsTabvE8typeStrs_rel +
                          *(int *)(_ZZL22drawGui_bufferViewsTabvE8typeStrs_rel + (ulong)*pcVar35 * 4
                                  ));
              ImGui::Text("Offset: %ld bytes",*(cgltf_size *)(pcVar35 + -6));
              ImGui::Text("Size: %ld bytes",*(cgltf_size *)(pcVar35 + -4));
              ImGui::Text("Stride: %ld bytes",*(cgltf_size *)(pcVar35 + -2));
              ImGui::Text("Buffer: %ld");
              ImGui::TreePop();
            }
            pcVar35 = pcVar35 + 0xe;
            pcVar33 = (cgltf_mesh *)((long)&pcVar27->name + 1);
            local_a8._0_8_ = pcVar27;
          } while ((char *)((long)pcVar27 + (1 - cVar25)) != (char *)0x1);
        }
        ImGui::EndTabItem();
      }
      bVar13 = ImGui::BeginTabItem("Accessors",(bool *)0x0,0);
      if (bVar13) {
        pcVar23 = parsedData->accessors;
        pcVar33 = (cgltf_mesh *)parsedData->accessors_count;
        local_a8._0_8_ = (cgltf_mesh *)0x0;
        if (pcVar33 != (cgltf_mesh *)0x0) {
          pcVar27 = (cgltf_mesh *)0x1;
          do {
            pcVar36 = pcVar27;
            uStack_b8 = (u8 *)CONCAT44(scratch._size._4_4_,(uint)scratch._size);
            local_c0 = (undefined1  [8])scratch._data;
            tl::toStringBuffer<unsigned_long>((Span<char> *)local_c0,(unsigned_long *)local_a8);
            bVar13 = ImGui::CollapsingHeader((char *)scratch._data,0);
            if (bVar13) {
              ImGui::TreePush((void *)0x0);
              imguiAccessor(pcVar23);
              ImGui::TreePop();
            }
            pcVar23 = pcVar23 + 1;
            pcVar27 = (cgltf_mesh *)((long)&pcVar36->name + 1);
            local_a8._0_8_ = pcVar36;
          } while (pcVar36 != pcVar33);
        }
        ImGui::EndTabItem();
      }
      bVar13 = ImGui::BeginTabItem("Materials",(bool *)0x0,0);
      if (bVar13) {
        material = parsedData->materials;
        cVar25 = parsedData->materials_count;
        local_a8._0_8_ = (cgltf_mesh *)0x0;
        if (cVar25 != 0) {
          pcVar33 = (cgltf_mesh *)0x1;
          do {
            pcVar27 = pcVar33;
            uStack_b8 = (u8 *)CONCAT44(scratch._size._4_4_,(uint)scratch._size);
            local_c0 = (undefined1  [8])scratch._data;
            local_50._data = material->name;
            if ((u8 *)local_50._data == (u8 *)0x0) {
              local_50._data = "";
            }
            tl::toStringBuffer<unsigned_long,char[3],char_const*>
                      ((Span<char> *)local_c0,(unsigned_long *)local_a8,(char (*) [3])&local_50,
                       (char **)0x39a80b);
            bVar13 = ImGui::CollapsingHeader((char *)scratch._data,0);
            if (bVar13) {
              ImGui::TreePush((void *)0x0);
              imguiMaterial(material);
              ImGui::TreePop();
            }
            material = material + 1;
            pcVar33 = (cgltf_mesh *)((long)&pcVar27->name + 1);
            local_a8._0_8_ = pcVar27;
          } while ((char *)((long)pcVar27 + (1 - cVar25)) != (char *)0x1);
        }
        ImGui::EndTabItem();
      }
      bVar13 = ImGui::BeginTabItem("Skins",(bool *)0x0,0);
      if (bVar13) {
        cVar25 = parsedData->skins_count;
        if (cVar25 != 0) {
          pcVar39 = parsedData->skins;
          cVar31 = 0;
          local_88.end = (char *)pcVar39;
          local_88._16_8_ = cVar25;
          do {
            pcVar30 = pcVar39 + cVar31;
            bVar13 = ImGui::TreeNode(pcVar30,"%ld) %s",cVar31);
            if (bVar13) {
              ppcVar34 = pcVar30->joints;
              cVar32 = pcVar30->joints_count;
              bVar13 = ImGui::TreeNode(ppcVar34,"joints(%ld)",cVar32);
              if (bVar13) {
                if (cVar32 != 0) {
                  cVar25 = 0;
                  do {
                    pcVar4 = ppcVar34[cVar25];
                    if (pcVar4 == pcVar30->skeleton) {
                      ImGui::PushStyleColor(0,0xff0000ff);
                    }
                    ImGui::Text("%ld) %ld %s",cVar25,
                                ((long)pcVar4 - (long)parsedData->nodes >> 3) * -0x7b425ed097b425ed)
                    ;
                    if (pcVar4 == pcVar30->skeleton) {
                      ImGui::PopStyleColor(1);
                    }
                    cVar25 = cVar25 + 1;
                  } while (cVar32 != cVar25);
                }
                ImGui::TreePop();
                cVar25 = local_88._16_8_;
                pcVar39 = (cgltf_skin *)local_88.end;
              }
              ImGui::TreePop();
            }
            cVar31 = cVar31 + 1;
          } while (cVar31 != cVar25);
        }
        ImGui::EndTabItem();
      }
      bVar13 = ImGui::BeginTabItem("Animations",(bool *)0x0,0);
      if (bVar13) {
        pcVar33 = (cgltf_mesh *)parsedData->animations;
        local_40 = (cgltf_mesh *)parsedData->animations_count;
        local_38 = (cgltf_mesh *)0x0;
        pcVar27 = pcVar33;
        if (local_40 != (cgltf_mesh *)0x0) {
          do {
            local_68 = pcVar27;
            pcVar27 = local_38;
            local_70 = (cgltf_mesh *)((long)local_38 * 0x38);
            uStack_b8 = (u8 *)CONCAT44(scratch._size._4_4_,(uint)scratch._size);
            local_c0 = (undefined1  [8])scratch._data;
            local_98._data = *(char **)((long)&local_70->name + (long)&pcVar33->name);
            if ((cgltf_primitive_type *)local_98._data == (cgltf_primitive_type *)0x0) {
              local_98._data = "(null)";
            }
            tl::toStringBuffer<unsigned_long,char[3],char_const*>
                      ((Span<char> *)local_c0,(unsigned_long *)&local_38,(char (*) [3])&local_98,
                       (char **)0x35adaf);
            bVar13 = ImGui::CollapsingHeader((char *)scratch._data,0);
            if (bVar13) {
              ImGui::TreePush((void *)0x0);
              local_60 = pcVar27;
              if (pcVar27 == (cgltf_mesh *)((long)(int)anims::playingInd + -1)) {
                local_98._data = (char *)0x0;
                bVar13 = ImGui::Button(anon_var_dwarf_a66b,(ImVec2 *)&local_98);
                if (bVar13) {
                  anims::playingInd = -anims::playingInd;
                }
              }
              else {
                local_98._data = (char *)0x0;
                bVar13 = ImGui::Button(anon_var_dwarf_a6a6,(ImVec2 *)&local_98);
                if (bVar13) {
                  if (-1 < (int)anims::playingInd ||
                      pcVar27 != (cgltf_mesh *)(ulong)~anims::playingInd) {
                    anims::time = 0.0;
                  }
                  anims::playingInd = (int)pcVar27 + 1;
                  tl::Vector<anims::NodeData>::resize<>
                            ((Vector<anims::NodeData> *)&anims::nodesData,parsedData->nodes_count);
                  pcVar10 = parsedData;
                  memset(anims::nodesData,0,parsedData->nodes_count * 0x18);
                  pcVar5 = pcVar10->animations;
                  local_98._data = (char *)0x0;
                  if (0 < (int)anims::playingInd) {
                    uVar40 = (ulong)(anims::playingInd - 1);
                    if (pcVar10->animations_count <= uVar40) {
                      __assert_fail("i < _size",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/tl/tl/span.hpp"
                                    ,0x51,
                                    "T &tl::Span<const cgltf_animation>::operator[](size_t) [T = const cgltf_animation]"
                                   );
                    }
                    cVar25 = pcVar5[uVar40].channels_count;
                    if (cVar25 != 0) {
                      pcVar6 = pcVar5[uVar40].channels;
                      lVar37 = 0;
                      do {
                        advanceAnimPathOffset
                                  ((size_t *)&local_98,
                                   *(cgltf_animation_path_type *)
                                    ((long)&pcVar6->target_path + lVar37));
                        lVar37 = lVar37 + 0x28;
                      } while (cVar25 * 0x28 != lVar37);
                    }
                  }
                  tl::Vector<float>::resize<>
                            ((Vector<float> *)anims::animData,(size_t)local_98._data);
                  local_88.start = (char *)0x0;
                  lVar37 = (long)(int)anims::playingInd;
                  if (0 < lVar37) {
                    pcVar5 = parsedData->animations;
                    tl::Vector<int>::resize<>
                              ((Vector<int> *)&anims::curKeyInds,pcVar5[lVar37 + -1].samplers_count)
                    ;
                    if (DAT_003fb990 != 0) {
                      memset(anims::curKeyInds,0xff,DAT_003fb990 << 2);
                    }
                    cVar25 = pcVar5[lVar37 + -1].channels_count;
                    if (cVar25 != 0) {
                      pcVar6 = pcVar5[lVar37 + -1].channels;
                      lVar41 = 0;
                      do {
                        lVar17 = *(long *)((long)&pcVar6->target_node + lVar41) -
                                 (long)parsedData->nodes >> 3;
                        uVar40 = lVar17 * -0x7b425ed097b425ed;
                        t = *(cgltf_animation_path_type *)((long)&pcVar6->target_path + lVar41);
                        if (t == cgltf_animation_path_type_scale) {
                          if ((ulong)anims::animData._8_8_ <= local_88.start) goto LAB_001196a2;
                          if (DAT_003fb948 <= uVar40) goto LAB_0011968b;
                          *(long *)((long)anims::nodesData + lVar17 * 0x71c71c71c71c71c8 + 0x10) =
                               (long)local_88.start * 4 + anims::animData._0_8_;
                        }
                        else if (t == cgltf_animation_path_type_rotation) {
                          if ((ulong)anims::animData._8_8_ <= local_88.start) goto LAB_001196a2;
                          if (DAT_003fb948 <= uVar40) goto LAB_0011968b;
                          *(long *)((long)anims::nodesData + lVar17 * 0x71c71c71c71c71c8 + 8) =
                               (long)local_88.start * 4 + anims::animData._0_8_;
                        }
                        else {
                          if (t != cgltf_animation_path_type_translation) {
                            __assert_fail("false",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/src/scene.cpp"
                                          ,0x1a4,"void anims::initAnim()");
                          }
                          if ((ulong)anims::animData._8_8_ <= local_88.start) {
LAB_001196a2:
                            pcVar16 = "T &tl::Vector<float>::operator[](size_t) [T = float]";
LAB_001196b7:
                            __assert_fail("i < _size",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/tl/tl/containers/vector.hpp"
                                          ,0x2c,pcVar16);
                          }
                          if (DAT_003fb948 <= uVar40) {
LAB_0011968b:
                            pcVar16 = 
                            "T &tl::Vector<anims::NodeData>::operator[](size_t) [T = anims::NodeData]"
                            ;
                            goto LAB_001196b7;
                          }
                          *(long *)((long)anims::nodesData + lVar17 * 0x71c71c71c71c71c8) =
                               (long)local_88.start * 4 + anims::animData._0_8_;
                        }
                        advanceAnimPathOffset((size_t *)&local_88,t);
                        lVar41 = lVar41 + 0x28;
                      } while (cVar25 * 0x28 != lVar41);
                    }
                    anims::duration = 0.0;
                    pcVar27 = local_60;
                    pcVar33 = local_68;
                    if (pcVar5[lVar37 + -1].samplers_count != 0) {
                      lVar41 = 0;
                      do {
                        lVar17 = *(long *)((long)&(pcVar5[lVar37 + -1].samplers)->input + lVar41);
                        if (*(int *)(lVar17 + 0x74) == 0) {
                          __assert_fail("sampler.input->has_max",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/src/scene.cpp"
                                        ,0x1ac,"void anims::initAnim()");
                        }
                        fVar46 = *(float *)(lVar17 + 0x78);
                        if (fVar46 <= anims::duration) {
                          fVar46 = anims::duration;
                        }
                        lVar41 = lVar41 + 0x28;
                        anims::duration = fVar46;
                      } while (pcVar5[lVar37 + -1].samplers_count * 0x28 != lVar41);
                    }
                  }
                }
              }
              ImGui::SameLine(0.0,-1.0);
              local_98._data = (char *)0x0;
              bVar13 = ImGui::Button(anon_var_dwarf_a6b1,(ImVec2 *)&local_98);
              if (bVar13) {
                anims::playingInd = 0;
                anims::time = 0.0;
              }
              pcVar36 = (cgltf_mesh *)((long)&pcVar33->name + (long)&local_70->name);
              ImGui::Text("time: %g / %g",SUB84((double)anims::time,0),(double)anims::duration);
              ptr_id = &pcVar36->weights;
              bVar13 = ImGui::TreeNode(ptr_id,"channels");
              local_70 = pcVar36;
              if (bVar13) {
                local_98._data = (char *)0x0;
                if (pcVar36->weights_count != 0) {
                  lVar37 = 0x10;
                  do {
                    pcVar16 = local_98._data;
                    pcVar7 = *ptr_id;
                    local_a8._8_8_ = CONCAT44(scratch._size._4_4_,(uint)scratch._size);
                    local_a8._0_8_ = scratch._data;
                    tl::toStringBuffer<unsigned_long>
                              ((Span<char> *)local_a8,(unsigned_long *)&local_98);
                    bVar13 = ImGui::TreeNode((char *)scratch._data);
                    if (bVar13) {
                      lVar41 = *(long *)((long)pcVar7 + lVar37 + -0x10);
                      puVar24 = *(undefined8 **)((long)pcVar7 + lVar37 + -8);
                      pcVar38 = pcVar36->primitives;
                      ImGui::Text("target node: %d) %s",
                                  (ulong)(uint)((int)((ulong)((long)puVar24 -
                                                             (long)parsedData->nodes) >> 3) *
                                               0x684bda13),*puVar24);
                      pcVar18 = cgltfAnimationPathStr
                                          (*(cgltf_animation_path_type *)((long)pcVar7 + lVar37));
                      ImGui::Text("target path: %s",pcVar18);
                      pcVar36 = local_70;
                      ImGui::Text("sampler: %d",
                                  (ulong)(uint)((int)((ulong)(lVar41 - (long)pcVar38) >> 3) *
                                               -0x33333333));
                      ImGui::TreePop();
                    }
                    local_98._data = (char *)((long)pcVar16 + 1);
                    lVar37 = lVar37 + 0x28;
                  } while (local_98._data < (long *)pcVar36->weights_count);
                }
                ImGui::TreePop();
                pcVar27 = local_60;
                pcVar33 = local_68;
              }
              local_58 = (cgltf_skin *)&pcVar36->primitives;
              bVar13 = ImGui::TreeNode(local_58,"samplers");
              if (bVar13) {
                local_88.start = (char *)0x0;
                pcVar39 = local_58;
                if (pcVar36->primitives_count != 0) {
                  do {
                    pcVar28 = &((cgltf_primitive *)pcVar39->name)->type + (long)local_88.start * 10;
                    local_50._size = CONCAT44(scratch._size._4_4_,(uint)scratch._size);
                    local_50._data = (char *)scratch._data;
                    local_88.end = local_88.start;
                    tl::toStringBuffer<unsigned_long>(&local_50,(unsigned_long *)&local_88);
                    bVar13 = ImGui::TreeNode((char *)scratch._data);
                    if (bVar13) {
                      pcVar16 = cgltfInterpolationStr(pcVar28[4]);
                      ImGui::Text("interpolation type: %s",pcVar16);
                      pcVar16 = cgltfComponentTypeStr(**(cgltf_component_type **)pcVar28);
                      ImGui::Text("Input compType: %s",pcVar16);
                      local_98._data = (char *)0xbf800000;
                      bVar13 = ImPlot::BeginPlot("","t",(char *)0x0,(ImVec2 *)&local_98,0,0,0,2,2,
                                                 (char *)0x0,(char *)0x0);
                      if (bVar13) {
                        local_98._size = local_98._size & 0xffffffff00000000;
                        local_98._data = (char *)pcVar28;
                        uVar15 = cgltfTypeNumComponents((*(cgltf_accessor **)(pcVar28 + 2))->type);
                        if (uVar15 - 1 < 4) {
                          local_88._16_8_ = ZEXT48(uVar15);
                          puVar24 = &DAT_003f10d0;
                          cVar25 = 0;
                          do {
                            local_98._size = CONCAT44(local_98._size._4_4_,(int)cVar25);
                            pcVar16 = (char *)*puVar24;
                            ImPlot::PlotLineG(pcVar16,sampleAnimDataForPlotting,&local_98,
                                              *(int *)(*(long *)pcVar28 + 0x18),0);
                            ImPlot::PlotScatterG
                                      (pcVar16,sampleAnimDataForPlotting,&local_98,
                                       *(int *)(*(long *)pcVar28 + 0x18),0);
                            cVar25 = cVar25 + 1;
                            puVar24 = puVar24 + 1;
                          } while (local_88._16_8_ != cVar25);
                        }
                        ImPlot::EndPlot();
                        pcVar36 = local_70;
                        pcVar39 = local_58;
                      }
                      ImGui::TreePop();
                    }
                    local_88.start = (char *)((long)(char **)local_88.end + 1);
                  } while (local_88.start < (cgltf_skin *)pcVar36->primitives_count);
                }
                ImGui::TreePop();
                pcVar27 = local_60;
                pcVar33 = local_68;
              }
              ImGui::TreePop();
            }
            local_38 = (cgltf_mesh *)((long)&pcVar27->name + 1);
            pcVar27 = local_68;
          } while (local_38 != local_40);
        }
        ImGui::EndTabItem();
      }
      bVar13 = ImGui::BeginTabItem("Cameras",(bool *)0x0,0);
      if (bVar13) {
        ptr_id_01 = parsedData->cameras;
        pvVar8 = (void *)parsedData->cameras_count;
        bVar13 = ImGui::BeginCombo("Use camera","[DEFAULT ORBIT]",0);
        if (bVar13) {
          if (-1 < (long)pvVar8) {
            pvVar45 = (void *)0xffffffffffffffff;
            do {
              ImGui::PushID(pvVar45);
              pcVar16 = "[DEFAULT ORBIT]";
              uVar15 = (uint)pvVar45;
              if (-1 < (int)uVar15) {
                if ((int)parsedData->cameras_count <= (int)uVar15) {
                  __assert_fail("ind < (int)parsedData->cameras_count",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/src/scene.cpp"
                                ,0x16a,"const char *getCameraName(int)");
                }
                pcVar16 = parsedData->cameras[uVar15 & 0x7fffffff].name;
                if (pcVar16 == (char *)0x0) {
                  pcVar16 = "(null)";
                }
                pcVar18 = (char *)(ulong)(uint)scratch._size;
                local_c0 = (undefined1  [8])scratch._data;
                uStack_b8 = scratch._data;
                local_b0 = (uint)scratch._size;
                tl::CStrT<char>::CStrT((CStrT<char> *)local_a8,"%d) %s");
                str_05._str = pcVar18;
                str_05._0_8_ = local_a8._8_8_;
                tl::toStringBufferT((tl *)local_c0,(FmtBuffer *)(local_a8._0_8_ & 0xffffffff),str_05
                                   );
                tl::CStrT<char>::CStrT((CStrT<char> *)local_a8,pcVar16);
                str_06._str = pcVar18;
                str_06._0_8_ = local_a8._8_8_;
                tl::toStringBufferT((tl *)local_c0,(FmtBuffer *)(local_a8._0_8_ & 0xffffffff),str_06
                                   );
                if (local_b0 == 0) {
                  uStack_b8[-1] = '\0';
                  pcVar16 = (char *)scratch._data;
                }
                else {
                  *uStack_b8 = '\0';
                  uStack_b8 = uStack_b8 + 1;
                  local_b0 = local_b0 - 1;
                  pcVar16 = (char *)scratch._data;
                }
              }
              local_c0._0_4_ = 0.0;
              local_c0._4_4_ = 0.0;
              bVar13 = ImGui::Selectable(pcVar16,false,0,(ImVec2 *)local_c0);
              if (bVar13) {
                imgui_state::selectedSceneInd = uVar15;
              }
              ImGui::PopID();
              pvVar45 = (void *)((long)pvVar45 + 1);
            } while (pvVar8 != pvVar45);
          }
          ImGui::EndCombo();
        }
        bVar13 = ImGui::CollapsingHeader("Cameras",0);
        if (pvVar8 != (void *)0x0 && bVar13) {
          pvVar45 = (void *)0x0;
          do {
            bVar13 = ImGui::TreeNode(ptr_id_01,"%ld) %s",pvVar45);
            if (bVar13) {
              ImGui::Text("Name: %s",ptr_id_01->name);
              cgltfCameraTypeStr(ptr_id_01->type);
              ImGui::Text("Type: %s");
              if (ptr_id_01->type == cgltf_camera_type_orthographic) {
                ImGui::Text("SizeXY: %g x %g",
                            SUB84((double)(ptr_id_01->data).perspective.aspect_ratio,0),
                            (double)(ptr_id_01->data).perspective.yfov);
LAB_0011934d:
                ImGui::Text("Near: %g",SUB84((double)(ptr_id_01->data).perspective.znear,0));
                ImGui::Text("Far: %g",SUB84((double)(ptr_id_01->data).perspective.zfar,0));
              }
              else if (ptr_id_01->type == cgltf_camera_type_perspective) {
                ImGui::Text("Aspect ratio: %g",
                            SUB84((double)(ptr_id_01->data).perspective.aspect_ratio,0));
                ImGui::Text("Fov Y: %g",SUB84((double)(ptr_id_01->data).perspective.yfov,0));
                goto LAB_0011934d;
              }
              ImGui::TreePop();
            }
            pvVar45 = (void *)((long)pvVar45 + 1);
            ptr_id_01 = ptr_id_01 + 1;
          } while (pvVar8 != pvVar45);
        }
        ImGui::EndTabItem();
      }
      bVar13 = ImGui::BeginTabItem("Lights",(bool *)0x0,0);
      if (bVar13) {
        cVar25 = parsedData->lights_count;
        if (cVar25 != 0) {
          pcVar29 = parsedData->lights;
          cVar31 = 0;
          do {
            bVar13 = ImGui::TreeNode(&parsedData->lights,"%ld) %s",cVar31);
            if (bVar13) {
              ImGui::Text("Name: %s",pcVar29->name);
              ImGui::Text("Color: ");
              ImGui::SameLine(0.0,-1.0);
              local_c0._0_4_ = pcVar29->color[0];
              local_c0._4_4_ = pcVar29->color[1];
              uStack_b8 = (u8 *)CONCAT44(0x3f800000,pcVar29->color[2]);
              ImGui::TextColored((ImVec4 *)local_c0,"(%g, %g, %g)",
                                 SUB84((double)pcVar29->color[0],0),(double)pcVar29->color[1],
                                 (double)pcVar29->color[2]);
              ImGui::Text("Intensity: %g",SUB84((double)pcVar29->intensity,0));
              ImGui::Text("Range: %g",SUB84((double)pcVar29->range,0));
              if (cgltf_light_type_spot < pcVar29->type) {
                __assert_fail("(size_t)light.type < tl::size(lightTypeStrs)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/src/scene.cpp"
                              ,0x302,"void imguiLight(const cgltf_light &)");
              }
              ImGui::Text("Type: %s");
              if (pcVar29->type == cgltf_light_type_spot) {
                ImGui::Text("Inner cone angle: %g",SUB84((double)pcVar29->spot_inner_cone_angle,0));
                ImGui::Text("Outer cone angle: %g",SUB84((double)pcVar29->spot_outer_cone_angle,0));
              }
              ImGui::TreePop();
            }
            cVar31 = cVar31 + 1;
            pcVar29 = pcVar29 + 1;
          } while (cVar25 != cVar31);
        }
        ImGui::EndTabItem();
      }
      bVar13 = ImGui::BeginTabItem("Options",(bool *)0x0,0);
      if (bVar13) {
        bVar13 = ImGui::TreeNode("Orbit camera");
        if (bVar13) {
          ImGui::SliderFloat("Near",&camProjInfo.nearDist,0.0001,0.5,"%.3f",0);
          ImGui::SliderFloat("Far",&camProjInfo.farDist,camProjInfo.nearDist,100000.0,"%.3f",3);
          if (camProjInfo.farDist <= camProjInfo.nearDist + camProjInfo.nearDist) {
            camProjInfo.farDist = camProjInfo.nearDist + camProjInfo.nearDist;
          }
          ImGui::SliderAngle("FOV Y",&camProjInfo.fovY,1.0,175.0,"%.0f deg",0);
          ImGui::TreePop();
        }
        ImGui::Checkbox("Show axes",(bool *)&imgui_state::showAxes);
        ImGui::Checkbox("Show floor grid",(bool *)&imgui_state::showFloorGrid);
        ImGui::Checkbox("Show crosshair",(bool *)&imgui_state::showCrosshair);
        ImGui::SliderFloat("Crosshair scale",(float *)&imgui_state::crosshairScale,0.0,0.1,"%.3f",0)
        ;
        ImGui::EndTabItem();
      }
      ImGui::EndTabBar();
    }
  }
  ImGui::End();
  return;
}

Assistant:

void drawGui()
{
    if(!parsedData) {
        ImGui::Begin("drag & drop a glTF file##0");
        ImGui::End();
        return;
    }

    ImGui::PushStyleVar(ImGuiStyleVar_WindowPadding, ImVec2(1,1));
    tl::toStringBuffer(scratchStr(), openedFilePath, "##0");
    ImGui::Begin(scratchStr());
    ImGui::PopStyleVar();

    if (ImGui::BeginTabBar("TopTabBar"))
    {
        if (ImGui::BeginTabItem("Scenes")) {
            drawGui_scenesTab();
            ImGui::EndTabItem();
        }
        if(ImGui::BeginTabItem("Meshes")) {
            drawGui_meshesTab();
            ImGui::EndTabItem();
        }
        if(ImGui::BeginTabItem("Textures")) {
            drawGui_texturesTab();
            ImGui::EndTabItem();
        }
        if(ImGui::BeginTabItem("Buffers")) {
            drawGui_buffersTab();
            ImGui::EndTabItem();
        }
        if(ImGui::BeginTabItem("BufferViews")) {
            drawGui_bufferViewsTab();
            ImGui::EndTabItem();
        }
        if(ImGui::BeginTabItem("Accessors")) {
            drawGui_accessorsTab();
            ImGui::EndTabItem();
        }
        if(ImGui::BeginTabItem("Materials")) {
            drawGui_materialsTab();
            ImGui::EndTabItem();
        }
        if(ImGui::BeginTabItem("Skins")) {
            drawGui_skins();
            ImGui::EndTabItem();
        }
        if(ImGui::BeginTabItem("Animations")) {
            drawGui_animations();
            ImGui::EndTabItem();
        }
        if(ImGui::BeginTabItem("Cameras")) {
            drawGui_cameras();
            ImGui::EndTabItem();
        }
        if(ImGui::BeginTabItem("Lights")) {
            drawGui_lights();
            ImGui::EndTabItem();
        }

        if(ImGui::BeginTabItem("Options")) {
            drawGui_options();
            ImGui::EndTabItem();
        }

        ImGui::EndTabBar();
    }

    ImGui::End();
}